

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O1

int Abc_FlowRetime_GetLag(Abc_Obj_t *pObj)

{
  uint uVar1;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 8) {
    __assert_fail("!Abc_ObjIsLatch(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                  ,0x52c,"int Abc_FlowRetime_GetLag(Abc_Obj_t *)");
  }
  uVar1 = pObj->Id;
  if ((int)uVar1 < pManMR->vLags->nSize) {
    if (-1 < (int)uVar1) {
      return pManMR->vLags->pArray[uVar1];
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  __assert_fail("(int)Abc_ObjId(pObj) < Vec_IntSize(pManMR->vLags)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                ,0x52d,"int Abc_FlowRetime_GetLag(Abc_Obj_t *)");
}

Assistant:

int 
Abc_FlowRetime_GetLag( Abc_Obj_t *pObj ) {
  assert( !Abc_ObjIsLatch(pObj) );
  assert( (int)Abc_ObjId(pObj) < Vec_IntSize(pManMR->vLags) );

  return Vec_IntEntry(pManMR->vLags, Abc_ObjId(pObj));
}